

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O3

OrderCancelRequest * __thiscall
Application::queryOrderCancelRequest41(OrderCancelRequest *__return_storage_ptr__,Application *this)

{
  Application *this_00;
  FieldBase *this_01;
  FieldBase local_170;
  FieldBase local_118;
  FieldBase local_c0;
  FieldBase local_68;
  
  this_00 = this;
  queryOrigClOrdID((OrigClOrdID *)&local_170,this);
  queryClOrdID((ClOrdID *)&local_68,this_00);
  querySymbol((Symbol *)&local_c0,this_00);
  querySide((Side *)&local_118,this_00);
  this_01 = &local_170;
  FIX41::OrderCancelRequest::OrderCancelRequest
            (__return_storage_ptr__,(OrigClOrdID *)this_01,(ClOrdID *)&local_68,(Symbol *)&local_c0,
             (Side *)&local_118);
  FIX::FieldBase::~FieldBase(&local_118);
  FIX::FieldBase::~FieldBase(&local_c0);
  FIX::FieldBase::~FieldBase(&local_68);
  FIX::FieldBase::~FieldBase(&local_170);
  queryOrderQty((OrderQty *)&local_170,(Application *)this_01);
  FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,&local_170,true);
  FIX::FieldBase::~FieldBase(&local_170);
  queryHeader(this,(Header *)&(__return_storage_ptr__->super_Message).field_0x70);
  return __return_storage_ptr__;
}

Assistant:

FIX41::OrderCancelRequest Application::queryOrderCancelRequest41() {
  FIX41::OrderCancelRequest orderCancelRequest(queryOrigClOrdID(), queryClOrdID(), querySymbol(), querySide());

  orderCancelRequest.set(queryOrderQty());
  queryHeader(orderCancelRequest.getHeader());
  return orderCancelRequest;
}